

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O2

void add2C(int v)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int *piVar5;
  int *piVar6;
  ulong uVar7;
  size_t __position;
  long lVar8;
  ulong uVar9;
  
  __position = (size_t)v;
  std::bitset<15000UL>::reset(&P,__position);
  sizeP = sizeP + -1;
  if (CE_P_[__position] < 1) {
    std::bitset<15000UL>::set(&Cm,__position,true);
    in_Cm(v);
  }
  else {
    std::bitset<15000UL>::set(&Cp,__position,true);
    in_Cp(v);
  }
  piVar6 = AdjB;
  sizeC = sizeC + 1;
  CE_P_P = CE_P_P - CE_P_[__position];
  cnt_lP = cnt_lP + -1;
  iVar1 = AdjP[__position + 1];
  for (lVar4 = (long)AdjP[__position]; lVar4 < iVar1; lVar4 = lVar4 + 1) {
    iVar2 = piVar6[lVar4];
    neiC[iVar2] = neiC[iVar2] + 1;
    neiP[iVar2] = neiP[iVar2] + -1;
  }
  lVar8 = (long)NAdjP[__position];
  piVar6 = NAdjB + lVar8;
  lVar4 = lVar8 * 4;
  piVar5 = NAdjB;
  for (; lVar4 = lVar4 + 4, lVar8 < NAdjP[__position + 1]; lVar8 = lVar8 + 1) {
    iVar1 = *piVar6;
    uVar7 = (ulong)iVar1;
    iVar2 = CE_P_[uVar7];
    CE_P_[uVar7] = iVar2 + -1;
    uVar3 = Cp.super__Base_bitset<235UL>._M_w[uVar7 >> 6];
    uVar9 = 1L << ((byte)iVar1 & 0x3f);
    if ((((uVar3 >> (uVar7 & 0x3f) & 1) != 0) ||
        ((Cm.super__Base_bitset<235UL>._M_w[uVar7 >> 6] & uVar9) != 0)) &&
       (CE_Cp_P = CE_Cp_P + -1, iVar2 + -1 == 0 && (uVar3 & uVar9) != 0)) {
      add_from_Cp_to_Cm(iVar1);
      piVar5 = NAdjB;
    }
    piVar6 = (int *)((long)piVar5 + lVar4);
  }
  return;
}

Assistant:

inline void add2C(int v) {
    P.reset(v); --sizeP;
    if (CE_P_[v] > 0) {Cp.set(v); in_Cp(v);}
    else {Cm.set(v); in_Cm(v);}
    ++sizeC;

    CE_P_P -= CE_P_[v];
    --cnt_lP;

    FOR_NA(v, u) {++neiC[u]; --neiP[u];}

    FOR_C_NA(v, u) {
        --CE_P_[u];
        if (Cp[u] || Cm[u]) --CE_Cp_P;
        if (CE_P_[u] == 0 && Cp[u])
            add_from_Cp_to_Cm(u);
    }
}